

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O3

Vec_Int_t * Abc_NtkCollectEquivClasses(Abc_Ntk_t **pNtks,Gia_Man_t *pGia)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  Vec_Int_t *p;
  int *piVar8;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar9;
  Vec_Int_t *pVVar10;
  void *pvVar11;
  Vec_Ptr_t *pVVar12;
  Abc_Ntk_t *pAVar13;
  uint uVar14;
  ulong uVar15;
  int i;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  long lVar19;
  Vec_Int_t *vNexts [2];
  int *local_70;
  Vec_Int_t *local_48;
  int *local_40;
  Vec_Int_t *local_38;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar8 = (int *)malloc(400);
  p->pArray = piVar8;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar8 = (int *)malloc(4000);
  p_00->pArray = piVar8;
  uVar1 = pGia->nObjs;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  uVar6 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar6 = uVar1;
  }
  pVVar9->nCap = uVar6;
  if (uVar6 == 0) {
    pVVar9->pArray = (int *)0x0;
    pVVar9->nSize = uVar1;
  }
  else {
    local_70 = (int *)malloc((long)(int)uVar6 << 2);
    pVVar9->pArray = local_70;
    pVVar9->nSize = uVar1;
    if (local_70 != (int *)0x0) {
      memset(local_70,0xff,(long)(int)uVar1 << 2);
      goto LAB_002b9f70;
    }
  }
  local_70 = (int *)0x0;
LAB_002b9f70:
  pAVar13 = *pNtks;
  iVar2 = pAVar13->vObjs->nSize;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar7 = iVar2;
  }
  pVVar10->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar10->pArray = (int *)0x0;
    pVVar10->nSize = iVar2;
  }
  else {
    piVar8 = (int *)malloc((long)iVar7 << 2);
    pVVar10->pArray = piVar8;
    pVVar10->nSize = iVar2;
    if (piVar8 != (int *)0x0) {
      memset(piVar8,0xff,(long)iVar2 << 2);
    }
  }
  iVar2 = pNtks[1]->vObjs->nSize;
  local_48 = pVVar10;
  piVar8 = (int *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar7 = iVar2;
  }
  *piVar8 = iVar7;
  if (iVar7 == 0) {
    piVar8[2] = 0;
    piVar8[3] = 0;
    piVar8[1] = iVar2;
  }
  else {
    pvVar11 = malloc((long)iVar7 << 2);
    *(void **)(piVar8 + 2) = pvVar11;
    piVar8[1] = iVar2;
    if (pvVar11 != (void *)0x0) {
      memset(pvVar11,0xff,(long)iVar2 << 2);
    }
  }
  pVVar12 = pAVar13->vCis;
  local_40 = piVar8;
  local_38 = pVVar10;
  if (0 < pVVar12->nSize) {
    lVar19 = 0;
    do {
      Abc_NtkCollectAddOne
                (0,*(int *)((long)pVVar12->pArray[lVar19] + 0x10),
                 *(int *)((long)pVVar12->pArray[lVar19] + 0x40),pGia,pVVar9,&local_48);
      lVar19 = lVar19 + 1;
      pVVar12 = (*pNtks)->vCis;
    } while (lVar19 < pVVar12->nSize);
  }
  lVar19 = 0;
  bVar5 = true;
  do {
    bVar18 = bVar5;
    pAVar13 = pNtks[lVar19];
    pVVar12 = pAVar13->vObjs;
    if (0 < pVVar12->nSize) {
      lVar16 = 0;
      do {
        pvVar11 = pVVar12->pArray[lVar16];
        if ((pvVar11 != (void *)0x0) && ((*(uint *)((long)pvVar11 + 0x14) & 0xf) == 7)) {
          Abc_NtkCollectAddOne
                    ((int)lVar19,*(int *)((long)pvVar11 + 0x10),*(int *)((long)pvVar11 + 0x40),pGia,
                     pVVar9,&local_48);
          pAVar13 = pNtks[lVar19];
        }
        lVar16 = lVar16 + 1;
        pVVar12 = pAVar13->vObjs;
      } while (lVar16 < pVVar12->nSize);
    }
    lVar19 = 1;
    bVar5 = false;
  } while (bVar18);
  if (0 < (int)uVar1) {
    uVar17 = 0;
    do {
      uVar6 = local_70[uVar17];
      p->nSize = 0;
      if (-1 < (int)uVar6) {
        do {
          Vec_IntPush(p,uVar6);
          if ((&local_48)[uVar6 & 1]->nSize <= (int)(uVar6 >> 2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar6 = (&local_48)[uVar6 & 1]->pArray[uVar6 >> 2];
        } while (-1 < (int)uVar6);
        uVar6 = p->nSize;
        if (1 < (int)uVar6) {
          puVar4 = (uint *)p->pArray;
          uVar15 = 0;
          uVar14 = uVar6;
          do {
            uVar14 = uVar14 - 1;
            uVar3 = puVar4[uVar15];
            puVar4[uVar15] = puVar4[(int)uVar14];
            puVar4[(int)uVar14] = uVar3;
            uVar15 = uVar15 + 1;
          } while (uVar6 >> 1 != uVar15);
          uVar14 = *puVar4;
          uVar15 = 0;
          do {
            puVar4[uVar15] = puVar4[uVar15] ^ uVar14 & 2;
            uVar15 = uVar15 + 1;
          } while (uVar6 != uVar15);
          Vec_IntPush(p_00,uVar6);
          uVar15 = 0;
          do {
            Vec_IntPush(p_00,puVar4[uVar15]);
            uVar15 = uVar15 + 1;
          } while (uVar6 != uVar15);
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar1);
  }
  if (local_70 != (int *)0x0) {
    free(local_70);
  }
  free(pVVar9);
  pVVar9 = local_38;
  if (local_38->pArray != (int *)0x0) {
    free(local_38->pArray);
  }
  free(pVVar9);
  if (*(void **)(piVar8 + 2) != (void *)0x0) {
    free(*(void **)(piVar8 + 2));
  }
  free(piVar8);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  return p_00;
}

Assistant:

Vec_Int_t * Abc_NtkCollectEquivClasses( Abc_Ntk_t * pNtks[2], Gia_Man_t * pGia )
{
    Vec_Int_t * vClass = Vec_IntAlloc( 100 );
    Vec_Int_t * vClasses = Vec_IntAlloc( 1000 );
    Vec_Int_t * vGia2Cla = Vec_IntStartFull( Gia_ManObjNum(pGia) ); // mapping objId into classId
    Vec_Int_t * vNexts[2] = { Vec_IntStartFull(Abc_NtkObjNumMax(pNtks[0])), Vec_IntStartFull(Abc_NtkObjNumMax(pNtks[1])) };
    Abc_Obj_t * pObj;
    int n, i, k, Entry, fCompl;
    Abc_NtkForEachCi( pNtks[0], pObj, i )
        Abc_NtkCollectAddOne( 0, Abc_ObjId(pObj), pObj->iTemp, pGia, vGia2Cla, vNexts );
    for ( n = 0; n < 2; n++ )
        Abc_NtkForEachNode( pNtks[n], pObj, i )
            Abc_NtkCollectAddOne( n, Abc_ObjId(pObj), pObj->iTemp, pGia, vGia2Cla, vNexts );
    Vec_IntForEachEntry( vGia2Cla, Entry, i )
    {
        Vec_IntClear( vClass );
        for ( ; Entry >= 0; Entry = Vec_IntEntry(vNexts[Entry&1], Entry>>2) )
            Vec_IntPush( vClass, Entry );
        if ( Vec_IntSize(vClass) < 2 )
            continue;
        Vec_IntReverseOrder( vClass );
        fCompl = 2 & Vec_IntEntry( vClass, 0 );
        Vec_IntForEachEntry( vClass, Entry, k )
            Vec_IntWriteEntry( vClass, k, Entry ^ fCompl );        
        Vec_IntPush( vClasses, Vec_IntSize(vClass) );
        Vec_IntAppend( vClasses, vClass );
    }
    Vec_IntFree( vGia2Cla );
    Vec_IntFree( vNexts[0] );
    Vec_IntFree( vNexts[1] );
    Vec_IntFree( vClass );
    return vClasses;
}